

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QRhiGles2::releaseCachedResources(QRhiGles2 *this)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  QRhiGles2 *in_RDI;
  long in_FS_OFFSET;
  uint shader;
  QHash<QRhiShaderStage,_unsigned_int> *__range1;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  QSurface *in_stack_ffffffffffffffc8;
  QHash<QRhiShaderStage,_unsigned_int> *this_00;
  QRhiGles2 *this_01;
  QHash<QRhiShaderStage,_unsigned_int> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = ensureContext(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar2) {
    this_00 = &in_RDI->m_shaderCache;
    QHash<QRhiShaderStage,_unsigned_int>::begin(in_stack_ffffffffffffffd8);
    QHash<QRhiShaderStage,_unsigned_int>::end(this_00);
    while (bVar2 = QHash<QRhiShaderStage,_unsigned_int>::iterator::operator!=
                             ((iterator *)this_00,
                              (iterator *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)), bVar2)
    {
      puVar3 = QHash<QRhiShaderStage,_unsigned_int>::iterator::operator*((iterator *)0x91aaab);
      in_stack_ffffffffffffffc4 = *puVar3;
      QOpenGLFunctions::glDeleteShader
                ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (GLuint)((ulong)in_RDI >> 0x20));
      QHash<QRhiShaderStage,_unsigned_int>::iterator::operator++((iterator *)this_01);
    }
    QHash<QRhiShaderStage,_unsigned_int>::clear
              ((QHash<QRhiShaderStage,_unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::clear
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::releaseCachedResources()
{
    if (!ensureContext())
        return;

    for (uint shader : m_shaderCache)
        f->glDeleteShader(shader);

    m_shaderCache.clear();

    m_pipelineCache.clear();
}